

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall fmt::v10::detail::bigint::multiply(bigint *this,uint32_t value)

{
  size_t sVar1;
  uint *puVar2;
  long lVar3;
  double_bigit result;
  size_t n;
  size_t i;
  ulong uStack_20;
  bigit carry;
  double_bigit wide_value;
  bigint *pbStack_10;
  uint32_t value_local;
  bigint *this_local;
  
  uStack_20 = (ulong)value;
  i._4_4_ = 0;
  n = 0;
  wide_value._4_4_ = value;
  pbStack_10 = this;
  sVar1 = buffer<unsigned_int>::size((buffer<unsigned_int> *)this);
  for (; n < sVar1; n = n + 1) {
    puVar2 = buffer<unsigned_int>::operator[]<unsigned_long>((buffer<unsigned_int> *)this,n);
    lVar3 = *puVar2 * uStack_20 + (ulong)i._4_4_;
    puVar2 = buffer<unsigned_int>::operator[]<unsigned_long>((buffer<unsigned_int> *)this,n);
    *puVar2 = (uint)lVar3;
    i._4_4_ = (uint)((ulong)lVar3 >> 0x20);
  }
  if (i._4_4_ != 0) {
    buffer<unsigned_int>::push_back((buffer<unsigned_int> *)this,(uint *)((long)&i + 4));
  }
  return;
}

Assistant:

FMT_CONSTEXPR20 void multiply(uint32_t value) {
    const double_bigit wide_value = value;
    bigit carry = 0;
    for (size_t i = 0, n = bigits_.size(); i < n; ++i) {
      double_bigit result = bigits_[i] * wide_value + carry;
      bigits_[i] = static_cast<bigit>(result);
      carry = static_cast<bigit>(result >> bigit_bits);
    }
    if (carry != 0) bigits_.push_back(carry);
  }